

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O2

void __thiscall
deqp::gls::DrawTest::DrawTest
          (DrawTest *this,TestContext *testCtx,RenderContext *renderCtx,char *name,char *desc)

{
  TestLog *log;
  allocator<char> local_39;
  string local_38;
  
  tcu::TestCase::TestCase(&this->super_TestCase,testCtx,name,desc);
  (this->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__DrawTest_00c42370;
  this->m_renderCtx = renderCtx;
  this->m_refBuffers = (ReferenceContextBuffers *)0x0;
  this->m_refContext = (ReferenceContext *)0x0;
  this->m_rrArrayPack = (AttributePack *)0x0;
  this->m_glesContext = (Context *)0x0;
  this->m_glArrayPack = (AttributePack *)0x0;
  this->m_maxDiffRed = -1;
  this->m_maxDiffGreen = -1;
  this->m_maxDiffBlue = -1;
  (this->m_specs).
  super__Vector_base<deqp::gls::DrawTestSpec,_std::allocator<deqp::gls::DrawTestSpec>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_specs).
  super__Vector_base<deqp::gls::DrawTestSpec,_std::allocator<deqp::gls::DrawTestSpec>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_specs).
  super__Vector_base<deqp::gls::DrawTestSpec,_std::allocator<deqp::gls::DrawTestSpec>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_iteration_descriptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_iteration_descriptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_iteration_descriptions).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_iteration = 0;
  log = testCtx->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Iteration result: ",&local_39);
  tcu::ResultCollector::ResultCollector(&this->m_result,log,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

DrawTest::DrawTest (tcu::TestContext& testCtx, glu::RenderContext& renderCtx, const char* name, const char* desc)
	: TestCase			(testCtx, name, desc)
	, m_renderCtx		(renderCtx)
	, m_refBuffers		(DE_NULL)
	, m_refContext		(DE_NULL)
	, m_glesContext		(DE_NULL)
	, m_glArrayPack		(DE_NULL)
	, m_rrArrayPack		(DE_NULL)
	, m_maxDiffRed		(-1)
	, m_maxDiffGreen	(-1)
	, m_maxDiffBlue		(-1)
	, m_iteration		(0)
	, m_result			(testCtx.getLog(), "Iteration result: ")
{
}